

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram.h
# Opt level: O2

iterator * __thiscall Histogram::begin(Histogram *this)

{
  size_t sVar1;
  iterator *in_RDI;
  
  sVar1 = 0;
  while ((sVar1 != 0x41 && (this->bins[sVar1].super___atomic_base<unsigned_long>._M_i == 0))) {
    sVar1 = sVar1 + 1;
  }
  in_RDI->idx = sVar1;
  in_RDI->maxBins = 0x41;
  in_RDI->owner = this;
  return in_RDI;
}

Assistant:

iterator begin() const {
        size_t i;
        for (i=0; i<MAX_BINS; ++i) {
            if (bins[i].load(std::memory_order_relaxed)) break;
        }
        return HistItr(i, MAX_BINS, this);
    }